

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O0

void aom_cdef_find_dir(uint16_t *in,cdef_list *dlist,int (*var) [16],int cdef_count,int coeff_shift,
                      int (*dir) [16])

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int bx_1;
  int by_1;
  int pos2;
  int pos1;
  int bx2;
  int by2;
  int bx;
  int by;
  int bi;
  int local_2c;
  
  for (local_2c = 0; local_2c < in_ECX + -1; local_2c = local_2c + 2) {
    uVar1 = (uint)*(byte *)(in_RSI + (long)local_2c * 2);
    uVar2 = (uint)*(byte *)(in_RSI + 1 + (long)local_2c * 2);
    uVar3 = (uint)*(byte *)(in_RSI + (long)(local_2c + 1) * 2);
    uVar4 = (uint)*(byte *)(in_RSI + 1 + (long)(local_2c + 1) * 2);
    (*cdef_find_dir_dual)
              ((uint16_t *)(in_RDI + (long)(int)(uVar1 * 0x480 + uVar2 * 8) * 2),
               (uint16_t *)(in_RDI + (long)(int)(uVar3 * 0x480 + uVar4 * 8) * 2),0x90,
               (int32_t *)(in_RDX + (long)(int)uVar1 * 0x40 + (long)(int)uVar2 * 4),
               (int32_t *)(in_RDX + (long)(int)uVar3 * 0x40 + (long)(int)uVar4 * 4),in_R8D,
               (int *)(in_R9 + (long)(int)uVar1 * 0x40 + (long)(int)uVar2 * 4),
               (int *)(in_R9 + (long)(int)uVar3 * 0x40 + (long)(int)uVar4 * 4));
  }
  if (in_ECX % 2 != 0) {
    uVar1 = (uint)*(byte *)(in_RSI + (long)local_2c * 2);
    uVar2 = (uint)*(byte *)(in_RSI + 1 + (long)local_2c * 2);
    iVar5 = (*cdef_find_dir)((uint16_t *)(in_RDI + (long)(int)(uVar1 * 0x480 + uVar2 * 8) * 2),0x90,
                             (int32_t *)(in_RDX + (long)(int)uVar1 * 0x40 + (long)(int)uVar2 * 4),
                             in_R8D);
    *(int *)(in_R9 + (long)(int)uVar1 * 0x40 + (long)(int)uVar2 * 4) = iVar5;
  }
  return;
}

Assistant:

static inline void aom_cdef_find_dir(const uint16_t *in, cdef_list *dlist,
                                     int var[CDEF_NBLOCKS][CDEF_NBLOCKS],
                                     int cdef_count, int coeff_shift,
                                     int dir[CDEF_NBLOCKS][CDEF_NBLOCKS]) {
  int bi;

  // Find direction of two 8x8 blocks together.
  for (bi = 0; bi < cdef_count - 1; bi += 2) {
    const int by = dlist[bi].by;
    const int bx = dlist[bi].bx;
    const int by2 = dlist[bi + 1].by;
    const int bx2 = dlist[bi + 1].bx;
    const int pos1 = 8 * by * CDEF_BSTRIDE + 8 * bx;
    const int pos2 = 8 * by2 * CDEF_BSTRIDE + 8 * bx2;
    cdef_find_dir_dual(&in[pos1], &in[pos2], CDEF_BSTRIDE, &var[by][bx],
                       &var[by2][bx2], coeff_shift, &dir[by][bx],
                       &dir[by2][bx2]);
  }

  // Process remaining 8x8 blocks here. One 8x8 at a time.
  if (cdef_count % 2) {
    const int by = dlist[bi].by;
    const int bx = dlist[bi].bx;
    dir[by][bx] = cdef_find_dir(&in[8 * by * CDEF_BSTRIDE + 8 * bx],
                                CDEF_BSTRIDE, &var[by][bx], coeff_shift);
  }
}